

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitRefTest(BinaryInstWriter *this,RefTest *curr)

{
  ulong uVar1;
  WasmBinaryWriter *this_00;
  Exactness exactness;
  HeapType type;
  undefined7 in_register_00000009;
  void *__buf;
  LEB<unsigned_int,_unsigned_char> *this_01;
  LEB<unsigned_int,_unsigned_char> local_2c;
  LEB<unsigned_int,_unsigned_char> local_28;
  uchar local_21;
  
  local_21 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_21);
  uVar1 = (curr->castType).id;
  if (((uint)uVar1 & 3) != 2 || uVar1 < 7) {
    this_01 = &local_2c;
    local_2c.value = 0x14;
  }
  else {
    this_01 = &local_28;
    local_28.value = 0x15;
  }
  LEB<unsigned_int,_unsigned_char>::write
            (this_01,(int)this->o,__buf,CONCAT71(in_register_00000009,uVar1 < 7));
  this_00 = this->parent;
  type = wasm::Type::getHeapType(&curr->castType);
  exactness = wasm::Type::getExactness(&curr->castType);
  WasmBinaryWriter::writeHeapType(this_00,type,exactness);
  return;
}

Assistant:

void BinaryInstWriter::visitRefTest(RefTest* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->castType.isNullable()) {
    o << U32LEB(BinaryConsts::RefTestNull);
  } else {
    o << U32LEB(BinaryConsts::RefTest);
  }
  parent.writeHeapType(curr->castType.getHeapType(),
                       curr->castType.getExactness());
}